

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Checks.h
# Opt level: O1

void UnitTest::CheckClose<double,double,double>
               (TestResults *results,double *expected,double *actual,double *tolerance,
               TestDetails *details)

{
  ostream *poVar1;
  char *failure;
  MemoryOutStream stream;
  undefined1 auStack_1c8 [408];
  
  if ((*actual < *expected - *tolerance) || (*expected + *tolerance < *actual)) {
    MemoryOutStream::MemoryOutStream((MemoryOutStream *)auStack_1c8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_1c8,"Expected ",9);
    poVar1 = std::ostream::_M_insert<double>(*expected);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," +/- ",5);
    poVar1 = std::ostream::_M_insert<double>(*tolerance);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," but was ",9);
    std::ostream::_M_insert<double>(*actual);
    failure = MemoryOutStream::GetText((MemoryOutStream *)auStack_1c8);
    TestResults::OnTestFailure(results,details,failure);
    MemoryOutStream::~MemoryOutStream((MemoryOutStream *)auStack_1c8,&MemoryOutStream::VTT);
    std::ios_base::~ios_base((ios_base *)(auStack_1c8 + 0x90));
  }
  return;
}

Assistant:

void CheckClose(TestResults& results, Expected const& expected, Actual const& actual, Tolerance const& tolerance,
                TestDetails const& details)
{
    if (!AreClose(expected, actual, tolerance))
    { 
        UnitTest::MemoryOutStream stream;
        stream << "Expected " << expected << " +/- " << tolerance << " but was " << actual;

        results.OnTestFailure(details, stream.GetText());
    }
}